

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_secp256k1.cpp
# Opt level: O2

ByteData * __thiscall
cfd::core::Secp256k1::NegatePubkeySecp256k1Ec
          (ByteData *__return_storage_ptr__,Secp256k1 *this,ByteData *pubkey)

{
  secp256k1_context *ctx;
  size_t sVar1;
  CfdException *pCVar2;
  int ret;
  allocator local_c1;
  undefined1 local_c0 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data;
  size_t byte_size;
  secp256k1_pubkey pubkey_secp;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  ctx = (secp256k1_context *)this->secp256k1_context_;
  if (ctx == (secp256k1_context *)0x0) {
    pubkey_secp.data._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 99;
    pubkey_secp.data[8] = 0xa7;
    pubkey_secp.data[9] = '\x01';
    pubkey_secp.data[10] = '\0';
    pubkey_secp.data[0xb] = '\0';
    pubkey_secp.data._16_8_ = anon_var_dwarf_4558e9;
    logger::warn<>((CfdSourceLocation *)&pubkey_secp,"Secp256k1 context is NULL.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&pubkey_secp,"Secp256k1 context is NULL.",(allocator *)local_c0);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&pubkey_secp);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar1 = ByteData::GetDataSize(pubkey);
  if (sVar1 != 0x21) {
    pubkey_secp.data._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 99;
    pubkey_secp.data[8] = 0xac;
    pubkey_secp.data[9] = '\x01';
    pubkey_secp.data[10] = '\0';
    pubkey_secp.data[0xb] = '\0';
    pubkey_secp.data._16_8_ = anon_var_dwarf_4558e9;
    logger::warn<>((CfdSourceLocation *)&pubkey_secp,"Invalid Argument pubkey size.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&pubkey_secp,"Invalid Pubkey size.",(allocator *)local_c0);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&pubkey_secp);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,pubkey);
  ret = secp256k1_ec_pubkey_parse
                  (ctx,(secp256k1_pubkey_conflict *)&pubkey_secp,
                   local_40._M_impl.super__Vector_impl_data._M_start,
                   (long)local_40._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_40._M_impl.super__Vector_impl_data._M_start);
  if (ret != 1) {
    local_c0._0_8_ = "cfdcore_secp256k1.cpp";
    local_c0._8_4_ = 0x1b8;
    local_c0._16_8_ = "NegatePubkeySecp256k1Ec";
    logger::warn<int&>((CfdSourceLocation *)local_c0,"secp256k1_ec_pubkey_parse Error.({})",&ret);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_c0,"Secp256k1 pubkey parse Error.",(allocator *)&byte_data);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_c0);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ret = secp256k1_ec_pubkey_negate(ctx,(secp256k1_pubkey_conflict *)&pubkey_secp);
  if (ret == 1) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data,0x41,
               (allocator_type *)local_c0);
    byte_size = (long)byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    ret = secp256k1_ec_pubkey_serialize
                    (ctx,byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,&byte_size,
                     (secp256k1_pubkey_conflict *)&pubkey_secp,0x102);
    if (ret == 1) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data,byte_size);
      ByteData::ByteData(__return_storage_ptr__,&byte_data);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
      return __return_storage_ptr__;
    }
    local_c0._0_8_ = "cfdcore_secp256k1.cpp";
    local_c0._8_4_ = 0x1ca;
    local_c0._16_8_ = "NegatePubkeySecp256k1Ec";
    logger::warn<int&>((CfdSourceLocation *)local_c0,"secp256k1_ec_pubkey_serialize Error.({})",&ret
                      );
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_c0,"Secp256k1 pubkey serialize Error.",&local_c1)
    ;
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_c0);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_c0._0_8_ = "cfdcore_secp256k1.cpp";
  local_c0._8_4_ = 0x1bf;
  local_c0._16_8_ = "NegatePubkeySecp256k1Ec";
  logger::warn<int&>((CfdSourceLocation *)local_c0,"secp256k1_ec_pubkey_negate Error.({})",&ret);
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)local_c0,"Secp256k1 pubkey negate Error.",(allocator *)&byte_data);
  CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_c0);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData Secp256k1::NegatePubkeySecp256k1Ec(const ByteData& pubkey) {
  secp256k1_context* context =
      static_cast<secp256k1_context*>(secp256k1_context_);

  if (secp256k1_context_ == NULL) {
    warn(CFD_LOG_SOURCE, "Secp256k1 context is NULL.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 context is NULL.");
  }
  if (pubkey.GetDataSize() != 33) {
    warn(CFD_LOG_SOURCE, "Invalid Argument pubkey size.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Pubkey size.");
  }

  int ret;
  const std::vector<uint8_t>& pubkey_data = pubkey.GetBytes();
  secp256k1_pubkey pubkey_secp;

  ret = secp256k1_ec_pubkey_parse(
      context, &pubkey_secp, pubkey_data.data(), pubkey_data.size());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_parse Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey parse Error.");
  }

  ret = secp256k1_ec_pubkey_negate(context, &pubkey_secp);
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_negate Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey negate Error.");
  }

  std::vector<uint8_t> byte_data(65);
  size_t byte_size = byte_data.size();
  ret = secp256k1_ec_pubkey_serialize(
      context, byte_data.data(), &byte_size, &pubkey_secp,
      SECP256K1_EC_COMPRESSED);
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_serialize Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 pubkey serialize Error.");
  }
  byte_data.resize(byte_size);
  return ByteData(byte_data);
}